

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

int pageant_sign(pageant_pubkey *key,ptrlen message,strbuf *out,uint32_t flags,char **retstr)

{
  uint uVar1;
  PageantClientOp *pco;
  char *pcVar2;
  int iVar3;
  ptrlen pl;
  
  pco = pageant_client_op_new();
  BinarySink_put_byte(pco->binarysink_,'\r');
  BinarySink_put_string(pco->binarysink_,key->blob->s,key->blob->len);
  BinarySink_put_stringpl(pco->binarysink_,message);
  BinarySink_put_uint32(pco->binarysink_,(ulong)flags);
  uVar1 = pageant_client_op_query(pco);
  pl = BinarySource_get_string(pco->binarysource_);
  if ((uVar1 == 0xe) && (pco->binarysource_[0].err == BSE_NO_ERROR)) {
    *retstr = (char *)0x0;
    BinarySink_put_datapl(out->binarysink_,pl);
    iVar3 = 0;
  }
  else {
    pcVar2 = dupstr("Agent failed to create signature");
    *retstr = pcVar2;
    iVar3 = 1;
  }
  pageant_client_op_free(pco);
  return iVar3;
}

Assistant:

int pageant_sign(struct pageant_pubkey *key, ptrlen message, strbuf *out,
                 uint32_t flags, char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();
    put_byte(pco, SSH2_AGENTC_SIGN_REQUEST);
    put_string(pco, key->blob->s, key->blob->len);
    put_stringpl(pco, message);
    put_uint32(pco, flags);
    unsigned reply = pageant_client_op_query(pco);
    ptrlen signature = get_string(pco);

    if (reply == SSH2_AGENT_SIGN_RESPONSE && !get_err(pco)) {
        *retstr = NULL;
        put_datapl(out, signature);
        pageant_client_op_free(pco);
        return PAGEANT_ACTION_OK;
    } else {
        *retstr = dupstr("Agent failed to create signature");
        pageant_client_op_free(pco);
        return PAGEANT_ACTION_FAILURE;
    }
}